

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O3

void telnet_ttype_is(telnet_t *telnet,char *ttype)

{
  char *__s;
  char local_4a [2];
  undefined1 local_48 [40];
  
  __s = "NVT";
  if (ttype != (char *)0x0) {
    __s = ttype;
  }
  local_48._0_4_ = TELNET_EV_SEND;
  local_48._8_8_ = telnet_ttype_is::IS;
  local_48._16_8_ = 4;
  (*telnet->eh)(telnet,(telnet_event_t *)local_48,telnet->ud);
  local_48._16_8_ = strlen(__s);
  local_48._0_4_ = TELNET_EV_SEND;
  local_48._8_8_ = __s;
  (*telnet->eh)(telnet,(telnet_event_t *)local_48,telnet->ud);
  local_48._8_8_ = local_4a;
  local_4a[0] = -1;
  local_4a[1] = -0x10;
  local_48._0_4_ = TELNET_EV_SEND;
  local_48._16_8_ = 2;
  (*telnet->eh)(telnet,(telnet_event_t *)local_48,telnet->ud);
  return;
}

Assistant:

void telnet_ttype_is(telnet_t *telnet, const char* ttype) {
	static const unsigned char IS[] = { TELNET_IAC, TELNET_SB,
			TELNET_TELOPT_TTYPE, TELNET_TTYPE_IS };
	if (!ttype) {
		ttype = "NVT";
	}
	_sendu(telnet, IS, sizeof(IS));
	_send(telnet, ttype, strlen(ttype));
	telnet_finish_sb(telnet);
}